

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device7.c
# Opt level: O2

void device5(void *arg)

{
  int line;
  int line_00;
  int iVar1;
  char *in_RCX;
  int sock;
  int sock_00;
  
  line = test_socket_impl((char *)0x2e,2,0x31,(int)in_RCX);
  test_bind_impl((char *)0x2f,line,0x104100,in_RCX);
  line_00 = test_socket_impl((char *)0x30,2,0x30,(int)in_RCX);
  test_bind_impl((char *)0x31,line_00,0x102176,in_RCX);
  iVar1 = nn_device(line,line_00);
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    if (iVar1 == 0x9523dfd) {
      test_close_impl((char *)0x38,line,sock);
      test_close_impl((char *)0x39,line_00,sock_00);
      return;
    }
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0 && nn_errno () == ETERM",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device7.c",
          0x35);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void device5 (NN_UNUSED void *arg)
{
    int rc;
    int dev0;
    int dev1;

    /*  Intialise the device sockets. */
    dev0 = test_socket (AF_SP_RAW, NN_REP);
    test_bind (dev0, socket_address_h);
    dev1 = test_socket (AF_SP_RAW, NN_REQ);
    test_bind (dev1, SOCKET_ADDRESS_I);

    /*  Run the device. */
    rc = nn_device (dev0, dev1);
    nn_assert (rc < 0 && nn_errno () == ETERM);

    /*  Clean up. */
    test_close (dev0);
    test_close (dev1);
}